

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_x11.c
# Opt level: O0

void aAppGrabInput(int grab)

{
  Window WVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int grab_local;
  
  if (grab != a_app_state->grabbed) {
    if (grab == 0) {
      XFixesShowCursor(a__x11.display,a__x11.window);
      XUngrabPointer(a__x11.display,0);
      a__app_state.grabbed = grab;
    }
    else {
      uVar2 = 0;
      uVar3 = 0;
      WVar1 = a__x11.window;
      XGrabPointer(a__x11.display,a__x11.window,1,0,1,1,a__x11.window,0,0);
      XFixesHideCursor(a__x11.display,a__x11.window);
      XWarpPointer(a__x11.display,0,a__x11.window,0,0,0,WVar1 & 0xffffffff00000000,
                   CONCAT44(uVar2,a__app_state.width >> 1),CONCAT44(uVar3,a__app_state.height >> 1))
      ;
      a__app_state.grabbed = grab;
    }
  }
  return;
}

Assistant:

void aAppGrabInput(int grab) {
	if (grab == a_app_state->grabbed)
		return;
	if (grab) {
		XGrabPointer(
			a__x11.display, a__x11.window, True, 0, GrabModeAsync, GrabModeAsync, a__x11.window, None, CurrentTime);
		XFixesHideCursor(a__x11.display, a__x11.window);
		XWarpPointer(a__x11.display, None, a__x11.window, 0, 0, 0, 0, a__app_state.width / 2, a__app_state.height / 2);
	} else {
		XFixesShowCursor(a__x11.display, a__x11.window);
		XUngrabPointer(a__x11.display, CurrentTime);
	}
	a__app_state.grabbed = grab;
}